

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_scientific.cpp
# Opt level: O0

int32_t __thiscall
icu_63::number::impl::ScientificHandler::getMultiplier(ScientificHandler *this,int32_t magnitude)

{
  int local_1c;
  int32_t digitsShown;
  int32_t interval;
  int32_t magnitude_local;
  ScientificHandler *this_local;
  
  local_1c = (int)this->fSettings->fEngineeringInterval;
  if ((this->fSettings->fRequireMinInt & 1U) == 0) {
    if (local_1c < 2) {
      local_1c = 1;
    }
    else {
      local_1c = (magnitude % local_1c + local_1c) % local_1c + 1;
    }
  }
  return (local_1c - magnitude) + -1;
}

Assistant:

int32_t ScientificHandler::getMultiplier(int32_t magnitude) const {
    int32_t interval = fSettings.fEngineeringInterval;
    int32_t digitsShown;
    if (fSettings.fRequireMinInt) {
        // For patterns like "000.00E0" and ".00E0"
        digitsShown = interval;
    } else if (interval <= 1) {
        // For patterns like "0.00E0" and "@@@E0"
        digitsShown = 1;
    } else {
        // For patterns like "##0.00"
        digitsShown = ((magnitude % interval + interval) % interval) + 1;
    }
    return digitsShown - magnitude - 1;
}